

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_split.c
# Opt level: O0

int main(int argc,char **argv)

{
  int iVar1;
  char **in_RSI;
  int in_EDI;
  int i;
  int n;
  int option;
  char *in_stack_00001048;
  int in_stack_00001054;
  int local_1c;
  uint uVar2;
  
  uVar2 = 0;
  while (iVar1 = getopt(in_EDI,in_RSI,"n:t:b:f:c"), iVar1 != -1) {
    switch(iVar1) {
    case 0x62:
      break;
    case 99:
      test_split_count((int)((ulong)in_RSI >> 0x20),(char **)CONCAT44(iVar1,uVar2));
      break;
    default:
      exit(1);
    case 0x66:
      break;
    case 0x6e:
      uVar2 = atoi(_optarg);
      printf("Set packet limit to %d\n",(ulong)uVar2);
      break;
    case 0x74:
    }
  }
  if (uVar2 != 0) {
    for (local_1c = 1; local_1c < in_EDI; local_1c = local_1c + 1) {
      iVar1 = access(in_RSI[local_1c],4);
      if (iVar1 == 0) {
        test_split_trace(in_stack_00001054,in_stack_00001048);
      }
    }
  }
  return 0;
}

Assistant:

int main(int argc, char * const argv[]) {
	// TODO: split trace in N intervals.
	// TODO: split trace in N bytes size.
	// ...
	// TODO: split trace using histogram function.
	int option = 0;
	int n = 0;

	while ((option = getopt(argc, argv, "n:t:b:f:c")) != -1) {
		switch (option) {
		case 'n':
			n = atoi(optarg);
			printf("Set packet limit to %d\n", n);
			break;
		case 't':
			break;
		case 'b':
			break;
		case 'f':
			break;
		case 'c':
			test_split_count(argc - optind, &argv[optind]);
			break;
		default:
			exit(EXIT_FAILURE);
		}
	}

	if (n != 0) {
		int i;
		for (i = 1; i < argc; ++i) {
			if (access(argv[i], F_OK | R_OK) == 0) {
				test_split_trace(n, argv[i]);
			}
		}
	}

	return 0;
}